

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

FT_Int afm_parser_read_vals(AFM_Parser parser,AFM_Value vals,FT_Int n)

{
  int iVar1;
  undefined4 uVar2;
  FT_Alloc_Func p_Var3;
  FT_Long FVar4;
  bool bVar5;
  int local_5c;
  FT_Memory pFStack_58;
  FT_Error error;
  FT_Memory memory;
  AFM_Value val;
  FT_Offset len;
  FT_Byte *pFStack_38;
  FT_Int i;
  char *str;
  AFM_Stream stream;
  AFM_Value pAStack_20;
  FT_Int n_local;
  AFM_Value vals_local;
  AFM_Parser parser_local;
  
  str = (char *)parser->stream;
  if (n < 6) {
    stream._4_4_ = n;
    pAStack_20 = vals;
    vals_local = (AFM_Value)parser;
    for (len._4_4_ = 0; len._4_4_ < stream._4_4_; len._4_4_ = len._4_4_ + 1) {
      memory = (FT_Memory)(pAStack_20 + len._4_4_);
      if (*(AFM_ValueType_ *)&memory->user == AFM_VALUE_TYPE_STRING) {
        pFStack_38 = (FT_Byte *)afm_stream_read_string((AFM_Stream)str);
      }
      else {
        pFStack_38 = (FT_Byte *)afm_stream_read_one((AFM_Stream)str);
      }
      if (pFStack_38 == (FT_Byte *)0x0) break;
      val = (AFM_Value)(~(ulong)pFStack_38 + *(long *)str);
      switch(*(undefined4 *)&memory->user) {
      case 0:
      case 1:
        pFStack_58 = *(FT_Memory *)vals_local;
        p_Var3 = (FT_Alloc_Func)ft_mem_qalloc(pFStack_58,(FT_Long)((long)&val->type + 1),&local_5c);
        memory->alloc = p_Var3;
        if (local_5c == 0) {
          memcpy(memory->alloc,pFStack_38,(size_t)val);
          memory->alloc[(long)val] = (_func_void_ptr_FT_Memory_long)0x0;
        }
        break;
      case 2:
        p_Var3 = (FT_Alloc_Func)PS_Conv_ToFixed(&stack0xffffffffffffffc8,pFStack_38 + (long)val,0);
        memory->alloc = p_Var3;
        break;
      case 3:
        FVar4 = PS_Conv_ToInt(&stack0xffffffffffffffc8,pFStack_38 + (long)val);
        *(int *)&memory->alloc = (int)FVar4;
        break;
      case 4:
        bVar5 = false;
        if (val == (AFM_Value)0x4) {
          iVar1 = strncmp((char *)pFStack_38,"true",4);
          bVar5 = iVar1 == 0;
        }
        *(bool *)&memory->alloc = bVar5;
        break;
      case 5:
        if (vals_local[1].u.s == (char *)0x0) {
          *(undefined4 *)&memory->alloc = 0;
        }
        else {
          uVar2 = (*(code *)vals_local[1].u)(pFStack_38,val,*(undefined8 *)(vals_local + 2));
          *(undefined4 *)&memory->alloc = uVar2;
        }
      }
    }
    parser_local._4_4_ = len._4_4_;
  }
  else {
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  afm_parser_read_vals( AFM_Parser  parser,
                        AFM_Value   vals,
                        FT_Int      n )
  {
    AFM_Stream  stream = parser->stream;
    char*       str;
    FT_Int      i;


    if ( n > AFM_MAX_ARGUMENTS )
      return 0;

    for ( i = 0; i < n; i++ )
    {
      FT_Offset  len;
      AFM_Value  val = vals + i;


      if ( val->type == AFM_VALUE_TYPE_STRING )
        str = afm_stream_read_string( stream );
      else
        str = afm_stream_read_one( stream );

      if ( !str )
        break;

      len = AFM_STREAM_KEY_LEN( stream, str );

      switch ( val->type )
      {
      case AFM_VALUE_TYPE_STRING:
      case AFM_VALUE_TYPE_NAME:
        {
          FT_Memory  memory = parser->memory;
          FT_Error   error;


          if ( !FT_QALLOC( val->u.s, len + 1 ) )
          {
            ft_memcpy( val->u.s, str, len );
            val->u.s[len] = '\0';
          }
        }
        break;

      case AFM_VALUE_TYPE_FIXED:
        val->u.f = PS_Conv_ToFixed( (FT_Byte**)(void*)&str,
                                    (FT_Byte*)str + len, 0 );
        break;

      case AFM_VALUE_TYPE_INTEGER:
        val->u.i = PS_Conv_ToInt( (FT_Byte**)(void*)&str,
                                  (FT_Byte*)str + len );
        break;

      case AFM_VALUE_TYPE_BOOL:
        val->u.b = FT_BOOL( len == 4                      &&
                            !ft_strncmp( str, "true", 4 ) );
        break;

      case AFM_VALUE_TYPE_INDEX:
        if ( parser->get_index )
          val->u.i = parser->get_index( str, len, parser->user_data );
        else
          val->u.i = 0;
        break;
      }
    }

    return i;
  }